

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O3

xml_node<char> * __thiscall
rapidxml::memory_pool<char>::allocate_node
          (memory_pool<char> *this,node_type type,char *name,char *value,size_t name_size,
          size_t value_size)

{
  long lVar1;
  xml_node<char> *pxVar2;
  size_t sVar3;
  
  pxVar2 = (xml_node<char> *)allocate_aligned(this,0x60);
  (pxVar2->super_xml_base<char>).m_parent = (xml_node<char> *)0x0;
  (pxVar2->super_xml_base<char>).m_name = (char *)0x0;
  (pxVar2->super_xml_base<char>).m_value = (char *)0x0;
  pxVar2->m_type = type;
  pxVar2->m_first_node = (xml_node<char> *)0x0;
  pxVar2->m_first_attribute = (xml_attribute<char> *)0x0;
  if (name != (char *)0x0) {
    if (name_size == 0) {
      sVar3 = 0xffffffffffffffff;
      do {
        name_size = sVar3 + 1;
        lVar1 = sVar3 + 1;
        sVar3 = name_size;
      } while (name[lVar1] != '\0');
    }
    (pxVar2->super_xml_base<char>).m_name = name;
    (pxVar2->super_xml_base<char>).m_name_size = name_size;
  }
  if (value != (char *)0x0) {
    if (value_size == 0) {
      sVar3 = 0xffffffffffffffff;
      do {
        value_size = sVar3 + 1;
        lVar1 = sVar3 + 1;
        sVar3 = value_size;
      } while (value[lVar1] != '\0');
    }
    (pxVar2->super_xml_base<char>).m_value = value;
    (pxVar2->super_xml_base<char>).m_value_size = value_size;
  }
  return pxVar2;
}

Assistant:

xml_node<Ch> *allocate_node(node_type type, 
                                    const Ch *name = 0, const Ch *value = 0, 
                                    std::size_t name_size = 0, std::size_t value_size = 0)
        {
            void *memory = allocate_aligned(sizeof(xml_node<Ch>));
            xml_node<Ch> *node = new(memory) xml_node<Ch>(type);
            if (name)
            {
                if (name_size > 0)
                    node->name(name, name_size);
                else
                    node->name(name);
            }
            if (value)
            {
                if (value_size > 0)
                    node->value(value, value_size);
                else
                    node->value(value);
            }
            return node;
        }